

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O3

int Rwr_GetBushSumOfVolumes(Rwr_Man_t *p,int Entry)

{
  ulong in_RAX;
  int iVar1;
  Rwr_Node_t *pNode;
  int Volume;
  undefined8 uStack_28;
  
  pNode = p->pTable[Entry];
  if (pNode == (Rwr_Node_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    uStack_28 = in_RAX;
    do {
      if (p->puCanons[*(uint *)&pNode->field_0xe & 0xffff] ==
          (unsigned_short)*(uint *)&pNode->field_0xe) {
        uStack_28 = uStack_28 & 0xffffffff;
        Rwr_ManIncTravId(p);
        Rwr_Trav2_rec(p,pNode,(int *)((long)&uStack_28 + 4));
        iVar1 = iVar1 + uStack_28._4_4_;
      }
      pNode = pNode->pNext;
    } while (pNode != (Rwr_Node_t *)0x0);
  }
  return iVar1;
}

Assistant:

int Rwr_GetBushSumOfVolumes( Rwr_Man_t * p, int Entry )
{
    Rwr_Node_t * pNode;
    int Volume, VolumeTotal = 0;
    for ( pNode = p->pTable[Entry]; pNode; pNode = pNode->pNext )
    {
        if ( pNode->uTruth != p->puCanons[pNode->uTruth] )
            continue;
        Volume = 0;
        Rwr_ManIncTravId( p );
        Rwr_Trav2_rec( p, pNode, &Volume );
        VolumeTotal += Volume;
    }
    return VolumeTotal;
}